

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_iq3_xxs(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *quant_weights_00;
  int64_t iVar1;
  
  if ((char)n_per_row == '\0') {
    if (0 < nrow) {
      quant_weights_00 = quant_weights;
      iVar1 = nrow;
      do {
        quantize_row_iq3_xxs_impl
                  ((int)src,(float *)dst,(void *)n_per_row,(int64_t)quant_weights,quant_weights_00);
        dst = (void *)((long)dst + (n_per_row >> 8) * 0x62);
        src = src + n_per_row;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    return nrow * (n_per_row >> 8) * 0x62;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             0xeb2,"GGML_ASSERT(%s) failed","n_per_row%QK_K == 0");
}

Assistant:

size_t quantize_iq3_xxs(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_xxs_impl(256, src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_xxs);
    }
    return nrow * nblock * sizeof(block_iq3_xxs);
}